

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

void slang::ast::PrimitiveInstanceSymbol::fromSyntax
               (PrimitiveSymbol *primitive,HierarchyInstantiationSyntax *syntax,ASTContext *context,
               SmallVectorBase<const_slang::ast::Symbol_*> *results,
               SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets)

{
  char *pcVar1;
  ASTContext *context_00;
  long lVar2;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attributes;
  Scope *this;
  PrimitiveSymbol *primitive_00;
  Compilation *compilation;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *this_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> sVar3;
  Symbol *symbol;
  const_iterator __begin0;
  SmallVector<int,_10UL> path;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>_>
  implicitNetNames;
  pointer in_stack_fffffffffffffe30;
  SmallVectorBase<int> *in_stack_fffffffffffffe40;
  PrimitiveInstanceSymbol *local_1b8;
  SmallVectorBase<const_slang::ast::Symbol_*> *local_1b0;
  Compilation *local_1a8;
  Compilation *local_1a0;
  iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*> local_198;
  ulong local_188;
  NetType *local_180;
  SmallVectorBase<const_slang::ast::Symbol_*> *local_178;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> local_170;
  undefined1 local_160 [64];
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>_>
  local_120;
  
  local_1b0 = results;
  local_1a0 = (Compilation *)primitive;
  local_178 = implicitNets;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>_>
  ::SmallSet(&local_120);
  local_160._0_8_ = local_160 + 0x18;
  local_160._8_8_ = 0;
  local_160._16_8_ = 10;
  local_1a8 = ASTContext::getCompilation(context);
  this = not_null<const_slang::ast::Scope_*>::get(&context->scope);
  local_180 = Scope::getDefaultNetType(this);
  local_198.index = 0;
  local_188 = (syntax->instances).elements.size_ + 1 >> 1;
  this_00 = &(syntax->super_MemberSyntax).attributes;
  local_198.list = &syntax->instances;
  for (; (local_198.list != &syntax->instances || (local_198.index != local_188));
      local_198.index = local_198.index + 1) {
    primitive_00 = (PrimitiveSymbol *)
                   slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::
                   iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*>::operator*
                             (&local_198);
    local_160._8_8_ = 0;
    anon_unknown.dwarf_383094::createImplicitNets
              ((HierarchicalInstanceSyntax *)primitive_00,context,local_180,&local_120,local_178);
    pcVar1 = (primitive_00->super_Symbol).name._M_str;
    if (pcVar1 == (char *)0x0) {
      compilation = (Compilation *)not_null<const_slang::ast::Scope_*>::get(&context->scope);
      sVar3 = slang::syntax::SyntaxList::operator_cast_to_span((SyntaxList *)this_00);
      attributes.size_ = (size_type)in_stack_fffffffffffffe30;
      attributes.data_ = (pointer)local_160;
      local_1b8 = anon_unknown_65::createPrimInst
                            ((anon_unknown_65 *)local_1a8,compilation,(Scope *)local_1a0,
                             primitive_00,(HierarchicalInstanceSyntax *)sVar3.data_,attributes,
                             (SmallVectorBase<int> *)sVar3.size_);
      SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                ((SmallVectorBase<slang::ast::Symbol_const*> *)local_1b0,(Symbol **)&local_1b8);
    }
    else {
      context_00 = *(ASTContext **)(pcVar1 + 0x40);
      lVar2 = *(long *)(pcVar1 + 0x48);
      local_170 = slang::syntax::SyntaxList::operator_cast_to_span((SyntaxList *)this_00);
      sVar3.size_ = (size_type)local_160;
      sVar3.data_ = (pointer)local_170.size_;
      in_stack_fffffffffffffe30 = (pointer)local_170.size_;
      local_1b8 = (PrimitiveInstanceSymbol *)
                  anon_unknown_65::recursePrimArray
                            ((anon_unknown_65 *)local_1a8,local_1a0,primitive_00,
                             (HierarchicalInstanceSyntax *)context,context_00,
                             (DimIterator)(&context_00->scope + lVar2),(DimIterator)local_170.data_,
                             sVar3,in_stack_fffffffffffffe40);
      SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*const&>
                ((SmallVectorBase<slang::ast::Symbol_const*> *)local_1b0,(Symbol **)&local_1b8);
    }
  }
  SmallVectorBase<int>::~SmallVectorBase((SmallVectorBase<int> *)local_160);
  ska::detailv3::
  sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>_>
  ::~sherwood_v3_table
            (&local_120.
              super_flat_hash_set<std::basic_string_view<char>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char>_>,_8UL>_>
              .
              super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>_>
            );
  return;
}

Assistant:

void PrimitiveInstanceSymbol::fromSyntax(const PrimitiveSymbol& primitive,
                                         const HierarchyInstantiationSyntax& syntax,
                                         const ASTContext& context,
                                         SmallVectorBase<const Symbol*>& results,
                                         SmallVectorBase<const Symbol*>& implicitNets) {
    createPrimitives(primitive, syntax, context, results, implicitNets);
}